

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O0

QString * __thiscall
QCborValue::toDiagnosticNotation(QCborValue *this,DiagnosticNotationOptions opts)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  DiagnosticNotationOptions in_stack_0000007c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  anon_unknown.dwarf_8921a0::DiagnosticNotation::create(this,in_stack_0000007c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QCborValue::toDiagnosticNotation(DiagnosticNotationOptions opts) const
{
    return DiagnosticNotation::create(*this, opts);
}